

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_base.hpp
# Opt level: O0

void boost::detail::function::
     functor_manager<boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>_>_>
     ::manage(function_buffer *in_buffer,function_buffer *out_buffer,
             functor_manager_operation_type op)

{
  type_info_t *ptVar1;
  stl_type_index local_28;
  functor_manager_operation_type local_1c;
  function_buffer *pfStack_18;
  functor_manager_operation_type op_local;
  function_buffer *out_buffer_local;
  function_buffer *in_buffer_local;
  
  local_1c = op;
  pfStack_18 = out_buffer;
  out_buffer_local = in_buffer;
  if (op == get_functor_type_tag) {
    local_28.data_ =
         (type_info_t *)
         typeindex::
         type_id<boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>>
                   ();
    ptVar1 = typeindex::stl_type_index::type_info(&local_28);
    *(type_info_t **)pfStack_18 = ptVar1;
    pfStack_18->data[8] = '\0';
    pfStack_18->data[9] = '\0';
  }
  else {
    manager(in_buffer,out_buffer,op);
  }
  return;
}

Assistant:

static inline void
        manage(const function_buffer& in_buffer, function_buffer& out_buffer,
               functor_manager_operation_type op)
        {
          typedef typename get_function_tag<functor_type>::type tag_type;
          switch (op) {
          case get_functor_type_tag:
            out_buffer.members.type.type = &boost::typeindex::type_id<functor_type>().type_info();
            out_buffer.members.type.const_qualified = false;
            out_buffer.members.type.volatile_qualified = false;
            return;

          default:
            manager(in_buffer, out_buffer, op, tag_type());
            return;
          }
        }